

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O1

void __thiscall cubeb_async_logger::cubeb_async_logger(cubeb_async_logger *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  cubeb_log_message *pcVar10;
  cubeb_log_message *pcVar11;
  long lVar12;
  int iVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  lVar12 = 0;
  (this->sleep_for).tv_sec = 0;
  (this->sleep_for).tv_nsec = 10000000;
  (this->msg_queue).capacity_ = 0x29;
  (this->msg_queue).data_._M_t.
  super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>._M_t.
  super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
  super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl = (cubeb_log_message *)0x0;
  pcVar10 = (cubeb_log_message *)operator_new__(0x2900);
  auVar9 = _DAT_001275b0;
  auVar8 = _DAT_00127590;
  auVar7 = _DAT_00127580;
  auVar6 = _DAT_00127570;
  auVar5 = _DAT_00127560;
  auVar4 = _DAT_00127550;
  auVar3 = _DAT_00127540;
  auVar2 = _DAT_00127530;
  auVar1 = _DAT_00127520;
  pcVar11 = pcVar10 + 0xf;
  do {
    auVar14._8_4_ = (int)lVar12;
    auVar14._0_8_ = lVar12;
    auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
    auVar16 = (auVar14 | auVar8) ^ auVar9;
    iVar13 = auVar16._0_4_;
    iVar15 = auVar16._8_4_;
    auVar25._4_4_ = iVar13;
    auVar25._0_4_ = iVar13;
    auVar25._8_4_ = iVar15;
    auVar25._12_4_ = iVar15;
    auVar33._0_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar33._4_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar33._8_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar33._12_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar17._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar33;
    auVar16 = pshuflw(auVar25,auVar17,0xe8);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar11[-0xf].storage[0] = '\0';
    }
    auVar16 = packssdw(auVar17,auVar17);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._0_4_ >> 8 & 1) != 0) {
      pcVar11[-0xe].storage[0] = '\0';
    }
    auVar16 = (auVar14 | auVar7) ^ auVar9;
    iVar13 = auVar16._0_4_;
    iVar15 = auVar16._8_4_;
    auVar26._4_4_ = iVar13;
    auVar26._0_4_ = iVar13;
    auVar26._8_4_ = iVar15;
    auVar26._12_4_ = iVar15;
    auVar34._0_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar34._4_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar34._8_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar34._12_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar18._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar34;
    auVar16 = packssdw(auVar26,auVar18);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._0_4_ >> 0x10 & 1) != 0) {
      pcVar11[-0xd].storage[0] = '\0';
    }
    auVar16 = pshufhw(auVar18,auVar18,0x84);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._0_4_ >> 0x18 & 1) != 0) {
      pcVar11[-0xc].storage[0] = '\0';
    }
    auVar16 = (auVar14 | auVar6) ^ auVar9;
    iVar13 = auVar16._0_4_;
    iVar15 = auVar16._8_4_;
    auVar27._4_4_ = iVar13;
    auVar27._0_4_ = iVar13;
    auVar27._8_4_ = iVar15;
    auVar27._12_4_ = iVar15;
    auVar35._0_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar35._4_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar35._8_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar35._12_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar19._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar35;
    auVar16 = pshuflw(auVar27,auVar19,0xe8);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pcVar11[-0xb].storage[0] = '\0';
    }
    auVar16 = packssdw(auVar19,auVar19);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._4_2_ >> 8 & 1) != 0) {
      pcVar11[-10].storage[0] = '\0';
    }
    auVar16 = (auVar14 | auVar5) ^ auVar9;
    iVar13 = auVar16._0_4_;
    iVar15 = auVar16._8_4_;
    auVar28._4_4_ = iVar13;
    auVar28._0_4_ = iVar13;
    auVar28._8_4_ = iVar15;
    auVar28._12_4_ = iVar15;
    auVar36._0_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar36._4_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar36._8_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar36._12_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar20._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar36;
    auVar16 = packssdw(auVar28,auVar20);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pcVar11[-9].storage[0] = '\0';
    }
    auVar16 = pshufhw(auVar20,auVar20,0x84);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._6_2_ >> 8 & 1) != 0) {
      pcVar11[-8].storage[0] = '\0';
    }
    auVar16 = (auVar14 | auVar4) ^ auVar9;
    iVar13 = auVar16._0_4_;
    iVar15 = auVar16._8_4_;
    auVar29._4_4_ = iVar13;
    auVar29._0_4_ = iVar13;
    auVar29._8_4_ = iVar15;
    auVar29._12_4_ = iVar15;
    auVar37._0_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar37._4_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar37._8_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar37._12_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar21._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar37;
    auVar16 = pshuflw(auVar29,auVar21,0xe8);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar11[-7].storage[0] = '\0';
    }
    auVar16 = packssdw(auVar21,auVar21);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._8_2_ >> 8 & 1) != 0) {
      pcVar11[-6].storage[0] = '\0';
    }
    auVar16 = (auVar14 | auVar3) ^ auVar9;
    iVar13 = auVar16._0_4_;
    iVar15 = auVar16._8_4_;
    auVar30._4_4_ = iVar13;
    auVar30._0_4_ = iVar13;
    auVar30._8_4_ = iVar15;
    auVar30._12_4_ = iVar15;
    auVar38._0_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar38._4_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar38._8_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar38._12_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar22._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar38;
    auVar16 = packssdw(auVar30,auVar22);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      pcVar11[-5].storage[0] = '\0';
    }
    auVar16 = pshufhw(auVar22,auVar22,0x84);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._10_2_ >> 8 & 1) != 0) {
      pcVar11[-4].storage[0] = '\0';
    }
    auVar16 = (auVar14 | auVar2) ^ auVar9;
    iVar13 = auVar16._0_4_;
    iVar15 = auVar16._8_4_;
    auVar31._4_4_ = iVar13;
    auVar31._0_4_ = iVar13;
    auVar31._8_4_ = iVar15;
    auVar31._12_4_ = iVar15;
    auVar39._0_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar39._4_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar39._8_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar39._12_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar23._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar39;
    auVar16 = pshuflw(auVar31,auVar23,0xe8);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pcVar11[-3].storage[0] = '\0';
    }
    auVar16 = packssdw(auVar23,auVar23);
    auVar16 = packssdw(auVar16,auVar16);
    auVar16 = packsswb(auVar16,auVar16);
    if ((auVar16._12_2_ >> 8 & 1) != 0) {
      pcVar11[-2].storage[0] = '\0';
    }
    auVar14 = (auVar14 | auVar1) ^ auVar9;
    iVar13 = auVar14._0_4_;
    iVar15 = auVar14._8_4_;
    auVar24._4_4_ = iVar13;
    auVar24._0_4_ = iVar13;
    auVar24._8_4_ = iVar15;
    auVar24._12_4_ = iVar15;
    auVar32._0_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar32._4_4_ = -(uint)(iVar13 < -0x7fffffd7);
    auVar32._8_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar32._12_4_ = -(uint)(iVar15 < -0x7fffffd7);
    auVar16._0_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._4_4_ = -(uint)(auVar14._4_4_ == -0x80000000);
    auVar16._8_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16._12_4_ = -(uint)(auVar14._12_4_ == -0x80000000);
    auVar16 = auVar16 & auVar32;
    auVar14 = packssdw(auVar24,auVar16);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pcVar11[-1].storage[0] = '\0';
    }
    auVar14 = pshufhw(auVar16,auVar16,0x84);
    auVar14 = packssdw(auVar14,auVar14);
    auVar14 = packsswb(auVar14,auVar14);
    if ((auVar14._14_2_ >> 8 & 1) != 0) {
      pcVar11->storage[0] = '\0';
    }
    lVar12 = lVar12 + 0x10;
    pcVar11 = pcVar11 + 0x10;
  } while (lVar12 != 0x30);
  (this->msg_queue).data_._M_t.
  super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>._M_t.
  super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
  super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl = pcVar10;
  LOCK();
  (this->msg_queue).write_index_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->msg_queue).read_index_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  run(this);
  return;
}

Assistant:

cubeb_async_logger() : msg_queue(CUBEB_LOG_MESSAGE_QUEUE_DEPTH) { run(); }